

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntWeakPtr<Diligent::TopLevelASVkImpl>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::TopLevelASVkImpl> *this,TopLevelASVkImpl *pObj)

{
  IReferenceCounters *Ptr;
  RefCountersImpl *pRVar1;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (pObj != (TopLevelASVkImpl *)0x0) {
    Ptr = RefCountedObject<Diligent::ITopLevelASVk>::GetReferenceCounters
                    ((RefCountedObject<Diligent::ITopLevelASVk> *)pObj);
    pRVar1 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>(Ptr);
    this->m_pRefCounters = pRVar1;
    LOCK();
    (pRVar1->m_NumWeakReferences).super___atomic_base<int>._M_i =
         (pRVar1->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }